

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFPrimitiveWriter.cpp
# Opt level: O1

EStatusCode __thiscall
CFFPrimitiveWriter::WriteCard16(CFFPrimitiveWriter *this,unsigned_short inValue)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int iVar2;
  EStatusCode EVar3;
  bool bVar4;
  undefined1 local_1a;
  undefined1 local_19;
  
  local_1a = (undefined1)(inValue >> 8);
  EVar3 = eFailure;
  iVar2 = -1;
  if (this->mInternalState != eFailure) {
    iVar1 = (*this->mCFFOutput->_vptr_IByteWriter[2])(this->mCFFOutput,&local_1a,1);
    iVar2 = -(uint)(CONCAT44(extraout_var,iVar1) != 1);
    if (CONCAT44(extraout_var,iVar1) != 1) {
      this->mInternalState = eFailure;
    }
  }
  local_19 = (undefined1)inValue;
  if (iVar2 == 0) {
    if (this->mInternalState == eFailure) {
      bVar4 = true;
    }
    else {
      iVar2 = (*this->mCFFOutput->_vptr_IByteWriter[2])(this->mCFFOutput,&local_19,1);
      bVar4 = CONCAT44(extraout_var_00,iVar2) != 1;
      if (bVar4) {
        this->mInternalState = eFailure;
      }
    }
    EVar3 = -(uint)bVar4;
  }
  return EVar3;
}

Assistant:

EStatusCode CFFPrimitiveWriter::WriteCard16(unsigned short inValue)
{
	Byte byte1 = (inValue>>8) & 0xff;
	Byte byte2 = inValue & 0xff;
    
	if(WriteByte(byte1) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;
    
	if(WriteByte(byte2) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;
    
	return PDFHummus::eSuccess;
}